

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.h
# Opt level: O0

int http1_consume_header_trailer
              (http1_parser_s *parser,uint8_t *start,uint8_t *end_name,uint8_t *start_value,
              uint8_t *end)

{
  int iVar1;
  long local_60;
  size_t i;
  anon_struct_16_2_62e3e2f5 http1_trailer_white_list [2];
  uint8_t *end_local;
  uint8_t *start_value_local;
  uint8_t *end_name_local;
  uint8_t *start_local;
  http1_parser_s *parser_local;
  
  http1_trailer_white_list[1].len = (long)end;
  if (((long)end_name - (long)start < 2) || (*start != 'x')) {
    http1_trailer_white_list[0].name = (char *)0xd;
    http1_trailer_white_list[0].len = 0;
    http1_trailer_white_list[1].name = (char *)0x0;
    local_60 = 0;
    while (http1_trailer_white_list[local_60 + -1].len != 0) {
      if ((end_name + -(long)start == (uint8_t *)http1_trailer_white_list[local_60].name) &&
         (iVar1 = memcmp(start,(void *)http1_trailer_white_list[local_60 + -1].len,
                         (size_t)http1_trailer_white_list[local_60].name), iVar1 == 0))
      goto LAB_001477b5;
      local_60 = local_60 + 1;
    }
    parser_local._4_4_ = 0;
  }
  else {
LAB_001477b5:
    iVar1 = http1_on_header(parser,(char *)start,(long)end_name - (long)start,(char *)start_value,
                            http1_trailer_white_list[1].len - (long)start_value);
    if (iVar1 == 0) {
      parser_local._4_4_ = 0;
    }
    else {
      parser_local._4_4_ = -1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

inline static int http1_consume_header_trailer(http1_parser_s *parser,
                                               uint8_t *start,
                                               uint8_t *end_name,
                                               uint8_t *start_value,
                                               uint8_t *end) {
  if ((end_name - start) > 1 && start[0] == 'x') {
    /* X- headers are allowed */
    goto white_listed;
  }

  /* white listed trailer names */
  const struct {
    char *name;
    long len;
  } http1_trailer_white_list[] = {
      {"server-timing", 13}, /* specific for client data... */
      {NULL, 0},             /* end of list marker */
  };
  for (size_t i = 0; http1_trailer_white_list[i].name; ++i) {
    if ((long)(end_name - start) == http1_trailer_white_list[i].len &&
        HEADER_NAME_IS_EQ((char *)start, http1_trailer_white_list[i].name,
                          http1_trailer_white_list[i].len)) {
      /* header disallowed here */
      goto white_listed;
    }
  }
  return 0;
white_listed:
  /* perform callback */
  if (http1_on_header(parser, (char *)start, (end_name - start),
                      (char *)start_value, end - start_value))
    return -1;
  return 0;
}